

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestP4.cxx
# Opt level: O0

bool __thiscall cmCTestP4::UpdateImpl(cmCTestP4 *this)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  cmCTest *pcVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last;
  string *psVar5;
  char *pcVar6;
  undefined1 local_3a0 [8];
  OutputLogger err;
  OutputLogger out;
  undefined1 local_308 [8];
  string date;
  string source;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  string local_2a8;
  string local_288;
  allocator<char> local_261;
  string local_260;
  undefined1 local_240 [8];
  string opts;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  p4_sync;
  undefined1 local_1e8 [8];
  ostringstream cmCTestLog_msg;
  allocator<char> local_59;
  string local_58;
  undefined1 local_38 [8];
  string custom;
  cmCTestP4 *this_local;
  
  pcVar1 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CTest;
  custom.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"P4UpdateCustom",&local_59)
  ;
  cmCTest::GetCTestConfiguration((string *)local_38,pcVar1,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    this_local._7_1_ = UpdateCustom(this,(string *)local_38);
  }
  else {
    bVar2 = std::operator==(&(this->super_cmCTestGlobalVC).OldRevision,"<unknown>");
    if (bVar2) {
      std::__cxx11::string::operator=
                ((string *)&(this->super_cmCTestGlobalVC).super_cmCTestVC.UpdateCommandLine,
                 "Unknown current revision");
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
      std::operator<<((ostream *)local_1e8,"   Unknown current revision\n");
      pcVar1 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CTest;
      std::__cxx11::ostringstream::str();
      pcVar6 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar1,7,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestP4.cxx"
                   ,0x1dc,pcVar6,false);
      std::__cxx11::string::~string
                ((string *)
                 &p4_sync.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
      this_local._7_1_ = false;
    }
    else {
      this_00 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&opts.field_2 + 8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(this_00);
      SetP4Options(this,this_00);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[5]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 (opts.field_2._M_local_buf + 8),(char (*) [5])0x11c2762);
      pcVar1 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CTest;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_260,"UpdateOptions",&local_261);
      cmCTest::GetCTestConfiguration((string *)local_240,pcVar1,&local_260);
      std::__cxx11::string::~string((string *)&local_260);
      std::allocator<char>::~allocator(&local_261);
      uVar4 = std::__cxx11::string::empty();
      if ((uVar4 & 1) != 0) {
        pcVar1 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CTest;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2a8,"P4UpdateOptions",
                   (allocator<char> *)
                   ((long)&args.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        cmCTest::GetCTestConfiguration(&local_288,pcVar1,&local_2a8);
        std::__cxx11::string::operator=((string *)local_240,(string *)&local_288);
        std::__cxx11::string::~string((string *)&local_288);
        std::__cxx11::string::~string((string *)&local_2a8);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&args.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      }
      cmSystemTools::ParseArguments
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)((long)&source.field_2 + 8),(string *)local_240);
      ::cm::
      append<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0>
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)((long)&opts.field_2 + 8),
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)((long)&source.field_2 + 8));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&date.field_2 + 8),
                     &(this->super_cmCTestGlobalVC).super_cmCTestVC.SourceDirectory,"/...");
      iVar3 = cmCTest::GetTestModel((this->super_cmCTestGlobalVC).super_cmCTestVC.CTest);
      if (iVar3 == 1) {
        cmCTestVC::GetNightlyTime_abi_cxx11_((string *)local_308,(cmCTestVC *)this);
        __first._M_current = (char *)std::__cxx11::string::begin();
        __last._M_current = (char *)std::__cxx11::string::end();
        out.super_LineParser._63_1_ = 0x2d;
        out.super_LineParser._62_1_ = 0x2f;
        std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                  (__first,__last,&out.super_LineParser.field_0x3f,&out.super_LineParser.field_0x3e)
        ;
        psVar5 = (string *)std::__cxx11::string::append(date.field_2._M_local_buf + 8);
        pcVar6 = (char *)std::__cxx11::string::append(psVar5);
        std::__cxx11::string::append(pcVar6);
        std::__cxx11::string::~string((string *)local_308);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&opts.field_2 + 8),(value_type *)((long)&date.field_2 + 8));
      cmProcessTools::OutputLogger::OutputLogger
                ((OutputLogger *)&err.super_LineParser.Separator,
                 (this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"p4_sync-out> ");
      cmProcessTools::OutputLogger::OutputLogger
                ((OutputLogger *)local_3a0,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,
                 "p4_sync-err> ");
      this_local._7_1_ =
           cmCTestVC::RunUpdateCommand
                     ((cmCTestVC *)this,
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)((long)&opts.field_2 + 8),(OutputParser *)&err.super_LineParser.Separator,
                      (OutputParser *)local_3a0,Auto);
      cmProcessTools::OutputLogger::~OutputLogger((OutputLogger *)local_3a0);
      cmProcessTools::OutputLogger::~OutputLogger((OutputLogger *)&err.super_LineParser.Separator);
      std::__cxx11::string::~string((string *)(date.field_2._M_local_buf + 8));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&source.field_2 + 8));
      std::__cxx11::string::~string((string *)local_240);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&opts.field_2 + 8));
    }
  }
  std::__cxx11::string::~string((string *)local_38);
  return this_local._7_1_;
}

Assistant:

bool cmCTestP4::UpdateImpl()
{
  std::string custom = this->CTest->GetCTestConfiguration("P4UpdateCustom");
  if (!custom.empty()) {
    return this->UpdateCustom(custom);
  }

  // If we couldn't get a revision number before updating, abort.
  if (this->OldRevision == "<unknown>") {
    this->UpdateCommandLine = "Unknown current revision";
    cmCTestLog(this->CTest, ERROR_MESSAGE, "   Unknown current revision\n");
    return false;
  }

  std::vector<std::string> p4_sync;
  this->SetP4Options(p4_sync);

  p4_sync.emplace_back("sync");

  // Get user-specified update options.
  std::string opts = this->CTest->GetCTestConfiguration("UpdateOptions");
  if (opts.empty()) {
    opts = this->CTest->GetCTestConfiguration("P4UpdateOptions");
  }
  std::vector<std::string> args = cmSystemTools::ParseArguments(opts);
  cm::append(p4_sync, args);

  std::string source = this->SourceDirectory + "/...";

  // Specify the start time for nightly testing.
  if (this->CTest->GetTestModel() == cmCTest::NIGHTLY) {
    std::string date = this->GetNightlyTime();
    // CTest reports the date as YYYY-MM-DD, Perforce needs it as YYYY/MM/DD
    std::replace(date.begin(), date.end(), '-', '/');

    // Revision specification: /...@"YYYY/MM/DD HH:MM:SS"
    source.append("@\"").append(date).append("\"");
  }

  p4_sync.push_back(source);

  OutputLogger out(this->Log, "p4_sync-out> ");
  OutputLogger err(this->Log, "p4_sync-err> ");

  return this->RunUpdateCommand(p4_sync, &out, &err);
}